

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_generator.hpp
# Opt level: O3

void __thiscall
ranger::bhvr_tree::
xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
::generate_children(xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
                    *this,xml_node<char> *data,node_type *node)

{
  xml_node<char> *data_00;
  abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *node_00;
  _Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
  local_40;
  generator_unit<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_rapidxml::xml_node<char>_*,_ranger::bhvr_tree::selector_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>
  local_38;
  
  data_00 = rapidxml::xml_node<char>::first_node(data,"bhvr_tree",0,true);
  if (data_00 != (xml_node<char> *)0x0) {
    do {
      generate_node_by_data
                ((xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
                  *)&stack0xffffffffffffffc8,(xml_node<char> *)this);
      if (local_38._vptr_generator_unit != (_func_int **)0x0) {
        local_40._M_head_impl =
             (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
              *)local_38._vptr_generator_unit;
        local_38._vptr_generator_unit = (_func_int **)0x0;
        node_00 = abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                  ::attach_child(node,(unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                                       *)&local_40);
        generate_children(this,data_00,node_00);
        if (local_40._M_head_impl !=
            (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
             *)0x0) {
          (*(local_40._M_head_impl)->_vptr_abstract_node[1])();
        }
        local_40._M_head_impl =
             (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
              *)0x0;
        if (local_38._vptr_generator_unit != (_func_int **)0x0) {
          (**(code **)(*local_38._vptr_generator_unit + 8))();
        }
      }
      data_00 = rapidxml::xml_node<char>::next_sibling(data_00,"bhvr_tree",0,true);
    } while (data_00 != (xml_node<char> *)0x0);
  }
  return;
}

Assistant:

void generate_children(rapidxml::xml_node<>* data, node_type& node) const {
    for (auto i = data->first_node("bhvr_tree"); i; i = i->next_sibling("bhvr_tree")) {
      auto child = generate_node_by_data(i);
      if (!child) {
        continue;
      }

      generate_children(i, *node.attach_child(std::move(child)));
    }
  }